

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Admin.h
# Opt level: O2

void __thiscall Admin::resizePersons(Admin *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  Person *pPVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  int i;
  long lVar7;
  long lVar8;
  University *pUVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  
  pUVar9 = Innopolis;
  bVar12 = 0;
  iVar1 = Innopolis->persons_count;
  uVar11 = (ulong)(iVar1 * 2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x60),8) == 0) {
    uVar10 = SUB168(auVar2 * ZEXT816(0x60),0);
  }
  pPVar3 = (Person *)operator_new__(uVar10);
  if (iVar1 != 0) {
    lVar8 = 0;
    do {
      Person::Person((Person *)((long)&pPVar3->_vptr_Person + lVar8));
      lVar8 = lVar8 + 0x60;
      pUVar9 = Innopolis;
    } while (uVar11 * 0x60 - lVar8 != 0);
  }
  lVar8 = 8;
  for (lVar7 = 0; lVar7 < pUVar9->persons_count; lVar7 = lVar7 + 1) {
    puVar5 = (undefined8 *)((long)&pUVar9->persons->_vptr_Person + lVar8);
    puVar6 = (undefined8 *)((long)&pPVar3->_vptr_Person + lVar8);
    for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar12 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar12 * -2 + 1;
    }
    lVar8 = lVar8 + 0x60;
  }
  pUVar9->persons_count = pUVar9->persons_count * 2;
  pUVar9->persons = pPVar3;
  return;
}

Assistant:

void resizePersons(){
        Person* resizesPersonList = new Person[Innopolis->persons_count*2];
        for(int i=0;i<Innopolis->persons_count;i++){
            resizesPersonList[i] = Innopolis->persons[i];
        }
        Innopolis->persons_count<<=1;
        Innopolis->persons = resizesPersonList;
    }